

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::fill<fmt::v7::detail::buffer_appender<char>,char>
          (buffer_appender<char> it,size_t n,fill_t<char> *fill)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> __result;
  fill_t<char> *in_RDX;
  ulong in_RSI;
  buffer<char> *in_RDI;
  size_t i;
  size_t fill_size;
  char *in_stack_ffffffffffffffc8;
  ulong __n;
  char *in_stack_ffffffffffffffd0;
  undefined8 local_10;
  undefined8 local_8;
  
  __result.container = (buffer<char> *)fill_t<char>::size(in_RDX);
  if (__result.container == (buffer<char> *)0x1) {
    fill_t<char>::operator[](in_RDX,0);
    local_8 = (buffer<char> *)
              std::fill_n<fmt::v7::detail::buffer_appender<char>,unsigned_long,char>
                        (__result.container,in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    local_10 = in_RDI;
    for (__n = 0; __n < in_RSI; __n = __n + 1) {
      fill_t<char>::data(in_RDX);
      local_10 = (buffer<char> *)
                 std::copy_n<char_const*,unsigned_long,fmt::v7::detail::buffer_appender<char>>
                           (in_stack_ffffffffffffffd0,__n,__result.container);
    }
    local_8 = local_10;
  }
  return (buffer_appender<char>)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_8;
}

Assistant:

FMT_NOINLINE OutputIt fill(OutputIt it, size_t n, const fill_t<Char>& fill) {
  auto fill_size = fill.size();
  if (fill_size == 1) return std::fill_n(it, n, fill[0]);
  for (size_t i = 0; i < n; ++i) it = std::copy_n(fill.data(), fill_size, it);
  return it;
}